

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O1

shared_ptr<mprpc::MpRpcMessage> __thiscall
mprpc::MpRpcMessage::parse(MpRpcMessage *this,char *utf8_buf,size_t len)

{
  msgpack_object *pmVar1;
  msgpack_object *pmVar2;
  uint *puVar3;
  uint64_t uVar4;
  undefined4 uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  bool bVar7;
  msgpack_unpack_return mVar8;
  int iVar9;
  uint uVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  shared_ptr<mprpc::MpRpcMessage> sVar15;
  shared_ptr<mprpc::MpRpcMessage> rpcmsg;
  string str;
  MpRpcMessage *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  
  local_60 = (MpRpcMessage *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mprpc::MpRpcMessage,std::allocator<mprpc::MpRpcMessage>>
            (&local_58,&local_60,(allocator<mprpc::MpRpcMessage> *)local_50);
  if (*utf8_buf == 'S') {
    bVar7 = snappy::Uncompress(utf8_buf + 5,len - 5,&local_60->_recv_data);
    _Var11._M_pi = extraout_RDX;
    if (bVar7) goto LAB_00139683;
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)&local_60->_recv_data,0,(char *)(local_60->_recv_data)._M_string_length,
               (ulong)utf8_buf);
LAB_00139683:
    mVar8 = msgpack_unpack((local_60->_recv_data)._M_dataplus._M_p,
                           (local_60->_recv_data)._M_string_length,(size_t *)0x0,&local_60->mp_zone,
                           &local_60->root);
    _Var11._M_pi = extraout_RDX_00;
    if ((mVar8 == MSGPACK_UNPACK_SUCCESS) && ((local_60->root).type == MSGPACK_OBJECT_MAP)) {
      if ((local_60->root).via.array.size != 0) {
        uVar13 = 0;
        do {
          pmVar1 = (local_60->root).via.array.ptr;
          if (pmVar1[uVar13 * 2].type == MSGPACK_OBJECT_STR) {
            pmVar2 = pmVar1[uVar13 * 2].via.array.ptr;
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_50,pmVar2,
                       (long)&pmVar2->type + (ulong)pmVar1[uVar13 * 2].via.array.size);
            iVar9 = std::__cxx11::string::compare((char *)local_50);
            if (iVar9 == 0) {
              _Var11._M_pi = extraout_RDX_01;
              if ((pmVar1[uVar13 * 2 + 1].type == MSGPACK_OBJECT_POSITIVE_INTEGER) ||
                 (pmVar1[uVar13 * 2 + 1].type == MSGPACK_OBJECT_NEGATIVE_INTEGER)) {
                local_60->id = pmVar1[uVar13 * 2 + 1].via.array.size;
              }
            }
            else {
              iVar9 = std::__cxx11::string::compare((char *)local_50);
              if (iVar9 == 0) {
                _Var11._M_pi = extraout_RDX_02;
                if (pmVar1[uVar13 * 2 + 1].type == MSGPACK_OBJECT_STR) {
                  std::__cxx11::string::_M_replace
                            ((ulong)local_60,0,(char *)(local_60->method)._M_string_length,
                             (ulong)pmVar1[uVar13 * 2 + 1].via.array.ptr);
                  _Var11._M_pi = extraout_RDX_07;
                }
              }
              else {
                iVar9 = std::__cxx11::string::compare((char *)local_50);
                if (iVar9 == 0) {
                  (local_60->params).via.array.ptr = pmVar1[uVar13 * 2 + 1].via.array.ptr;
                  uVar5 = *(undefined4 *)&pmVar1[uVar13 * 2 + 1].field_0x4;
                  uVar4 = pmVar1[uVar13 * 2 + 1].via.u64;
                  (local_60->params).type = pmVar1[uVar13 * 2 + 1].type;
                  *(undefined4 *)&(local_60->params).field_0x4 = uVar5;
                  (local_60->params).via.u64 = uVar4;
                  _Var11._M_pi = extraout_RDX_03;
                }
                else {
                  iVar9 = std::__cxx11::string::compare((char *)local_50);
                  if (iVar9 == 0) {
                    (local_60->result).via.array.ptr = pmVar1[uVar13 * 2 + 1].via.array.ptr;
                    uVar5 = *(undefined4 *)&pmVar1[uVar13 * 2 + 1].field_0x4;
                    uVar4 = pmVar1[uVar13 * 2 + 1].via.u64;
                    (local_60->result).type = pmVar1[uVar13 * 2 + 1].type;
                    *(undefined4 *)&(local_60->result).field_0x4 = uVar5;
                    (local_60->result).via.u64 = uVar4;
                    _Var11._M_pi = extraout_RDX_04;
                  }
                  else {
                    iVar9 = std::__cxx11::string::compare((char *)local_50);
                    _Var11._M_pi = extraout_RDX_05;
                    if (((iVar9 == 0) && (pmVar1[uVar13 * 2 + 1].type == MSGPACK_OBJECT_MAP)) &&
                       (pmVar1[uVar13 * 2 + 1].via.array.size != 0)) {
                      lVar14 = 0x28;
                      uVar12 = 0;
                      do {
                        pmVar2 = pmVar1[uVar13 * 2 + 1].via.array.ptr;
                        if (*(int *)((long)pmVar2 + lVar14 + -0x28) == 5) {
                          _Var11._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                          ((long)&pmVar2[-1].type + lVar14);
                          if (*(int *)&(_Var11._M_pi)->_vptr__Sp_counted_base == 0x65646f63) {
                            if (*(int *)((long)pmVar2 + lVar14 + -0x10) - 2U < 2) {
                              local_60->err_code = *(int *)((long)pmVar2 + lVar14 + -8);
                            }
                          }
                          else {
                            puVar3 = *(uint **)((long)&pmVar2[-1].type + lVar14);
                            uVar10 = *puVar3 ^ 0x7373656d;
                            _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                           (ulong)uVar10;
                            if ((*(int *)((long)puVar3 + 3) == 0x65676173 && uVar10 == 0) &&
                               (*(int *)((long)pmVar2 + lVar14 + -0x10) == 5)) {
                              std::__cxx11::string::_M_replace
                                        ((ulong)&local_60->err_msg,0,
                                         (char *)(local_60->err_msg)._M_string_length,
                                         *(ulong *)((long)&pmVar2->type + lVar14));
                              _Var11._M_pi = extraout_RDX_06;
                            }
                          }
                        }
                        uVar12 = uVar12 + 1;
                        lVar14 = lVar14 + 0x30;
                      } while (uVar12 < pmVar1[uVar13 * 2 + 1].via.array.size);
                    }
                  }
                }
              }
            }
            if (local_50[0] != local_40) {
              operator_delete(local_50[0]);
              _Var11._M_pi = extraout_RDX_08;
            }
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < (local_60->root).via.array.size);
      }
      _Var6._M_pi = local_58._M_pi;
      (this->method)._M_dataplus._M_p = (pointer)local_60;
      (this->method)._M_string_length = 0;
      local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->method)._M_string_length = (size_type)_Var6._M_pi;
      local_60 = (MpRpcMessage *)0x0;
      goto LAB_00139917;
    }
  }
  (this->method)._M_dataplus._M_p = (pointer)0x0;
  (this->method)._M_string_length = 0;
LAB_00139917:
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
    _Var11._M_pi = extraout_RDX_09;
  }
  sVar15.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  sVar15.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<mprpc::MpRpcMessage>)
         sVar15.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<MpRpcMessage> MpRpcMessage::parse(const char* utf8_buf, size_t len)
    {
        auto rpcmsg = make_shared<MpRpcMessage>();

        try {
            if (utf8_buf[0] == 'S') {
                //uint32_t orig_len = *(uint32_t*)(utf8_buf + 1);
                if (!snappy::Uncompress(utf8_buf + 5, len - 5, &rpcmsg->_recv_data))
                    return nullptr;
            }
            else {
                rpcmsg->_recv_data.assign(utf8_buf, len);
            }
            msgpack_unpack_return ret = msgpack_unpack(rpcmsg->_recv_data.c_str(), rpcmsg->_recv_data.size(),
                                                       nullptr, &rpcmsg->mp_zone, &rpcmsg->root);
            if ( ret != MSGPACK_UNPACK_SUCCESS)
                return nullptr;

            if (!is_map(rpcmsg->root)) return nullptr;

            for (uint32_t i = 0; i < rpcmsg->root.via.map.size; i++) {
                auto o = rpcmsg->root.via.map.ptr + i;
                if (o->key.type != MSGPACK_OBJECT_STR) continue;
                const string str(o->key.via.str.ptr, o->key.via.str.size);
                if (str == "id") {
                    if (o->val.type == MSGPACK_OBJECT_NEGATIVE_INTEGER)
                        rpcmsg->id = (int)o->val.via.i64;
                    else if (o->val.type == MSGPACK_OBJECT_POSITIVE_INTEGER)
                        rpcmsg->id = (int)o->val.via.u64;
                }
                else if (str == "method") {
                    if (o->val.type == MSGPACK_OBJECT_STR)
                        rpcmsg->method.assign(o->val.via.str.ptr, o->val.via.str.size);
                }
                else if (str == "params") {
                    rpcmsg->params = o->val;
                }
                else if (str == "result") {
                    rpcmsg->result = o->val;
                }
                else if (str == "error") {
                    if (o->val.type == MSGPACK_OBJECT_MAP) {
                        for (uint32_t n = 0; n < o->val.via.map.size; n++) {
                            auto p = o->val.via.map.ptr + n;
                            if (p->key.type == MSGPACK_OBJECT_STR && memcmp(p->key.via.str.ptr, "code", 4) == 0) {
                                if (p->val.type == MSGPACK_OBJECT_NEGATIVE_INTEGER)
                                    rpcmsg->err_code = (int)p->val.via.i64;
                                else if (p->val.type == MSGPACK_OBJECT_POSITIVE_INTEGER)
                                    rpcmsg->err_code = (int)p->val.via.u64;
                            }
                            else if (p->key.type == MSGPACK_OBJECT_STR && memcmp(p->key.via.str.ptr, "message", 7) == 0) {
                                if (p->val.type == MSGPACK_OBJECT_STR)
                                    rpcmsg->err_msg.assign(p->val.via.str.ptr, p->val.via.str.size);
                            }
                        }
                    }
                }
#if 0
                else if (str == "debug") {
                    if (o->val.type == MSGPACK_OBJECT_MAP) {
                        uint64_t recv_time = 0;
                        uint64_t send_time = 0;
                        for (uint32_t n = 0; n < o->val.via.map.size; n++) {
                            auto p = o->val.via.map.ptr + n;
                            if (p->key.type == MSGPACK_OBJECT_STR) {
                                if (memcmp(p->key.via.str.ptr, "recv_time", 9) == 0)
                                    recv_time = p->val.via.u64;
                                else if (memcmp(p->key.via.str.ptr, "send_time", 9) == 0)
                                    send_time = p->val.via.u64;
                            }
                        }
                        std::cout << "rsp_time: " << rpcmsg->method << " "
                            << (send_time - recv_time) << " "
                            << time_point_cast<microseconds>(system_clock::now()).time_since_epoch().count() - recv_time
                            << endl;
                    }
                }
#endif
            }
            return rpcmsg;
        }
        catch (exception& e) {
            cerr << "parse conf failure: " << e.what();
            return nullptr;
        }
    }